

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O2

int coda_get_product_version(coda_product *product,int *version)

{
  int iVar1;
  undefined8 uVar2;
  char *message;
  
  if (product == (coda_product *)0x0) {
    message = "product file argument is NULL (%s:%u)";
    uVar2 = 1000;
  }
  else {
    if (version != (int *)0x0) {
      if (product->product_definition == (coda_product_definition *)0x0) {
        iVar1 = -1;
      }
      else {
        iVar1 = product->product_definition->version;
      }
      *version = iVar1;
      return 0;
    }
    message = "version argument is NULL (%s:%u)";
    uVar2 = 0x3ed;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_get_product_version(const coda_product *product, int *version)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (version == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "version argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product->product_definition != NULL)
    {
        *version = product->product_definition->version;
    }
    else
    {
        *version = -1;
    }

    return 0;
}